

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtFlip(word *pTruth,int nWords,int iVar)

{
  word wVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  word t;
  int iStep;
  int i;
  word *pLimit;
  int shift;
  int w;
  int iVar_local;
  int nWords_local;
  word *pTruth_local;
  
  bVar3 = (byte)iVar;
  if (nWords == 1) {
    *pTruth = *pTruth << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) & s_Truths6[iVar] |
              (*pTruth & s_Truths6[iVar]) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f);
  }
  else if (iVar < 6) {
    for (pLimit._4_4_ = 0; pLimit._4_4_ < nWords; pLimit._4_4_ = pLimit._4_4_ + 1) {
      bVar4 = (byte)(1 << (bVar3 & 0x1f));
      pTruth[pLimit._4_4_] =
           pTruth[pLimit._4_4_] << (bVar4 & 0x3f) & s_Truths6[iVar] |
           (pTruth[pLimit._4_4_] & s_Truths6[iVar]) >> (bVar4 & 0x3f);
    }
  }
  else {
    iVar2 = Abc_TtWordNum(iVar);
    for (_iVar_local = pTruth; _iVar_local < pTruth + nWords;
        _iVar_local = _iVar_local + (iVar2 << 1)) {
      for (t._4_4_ = 0; t._4_4_ < iVar2; t._4_4_ = t._4_4_ + 1) {
        wVar1 = _iVar_local[t._4_4_];
        _iVar_local[t._4_4_] = _iVar_local[t._4_4_ + iVar2];
        _iVar_local[t._4_4_ + iVar2] = wVar1;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtFlip( word * pTruth, int nWords, int iVar )
{
    if ( nWords == 1 )
        pTruth[0] = ((pTruth[0] << (1 << iVar)) & s_Truths6[iVar]) | ((pTruth[0] & s_Truths6[iVar]) >> (1 << iVar));
	else if ( iVar <= 5 )
	{
		int w, shift = (1 << iVar);
		for ( w = 0; w < nWords; w++ )
            pTruth[w] = ((pTruth[w] << shift) & s_Truths6[iVar]) | ((pTruth[w] & s_Truths6[iVar]) >> shift);
	}
	else // if ( iVar > 5 )
	{
        word * pLimit = pTruth + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
		for ( ; pTruth < pLimit; pTruth += 2*iStep )
			for ( i = 0; i < iStep; i++ )
                ABC_SWAP( word, pTruth[i], pTruth[i + iStep] );
	}	
}